

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

Value * __thiscall
wabt::Decompiler::WrapChild
          (Value *__return_storage_ptr__,Decompiler *this,Value *child,string_view prefix,
          string_view postfix,Precedence precedence)

{
  string_view first_indent;
  Value *pVVar1;
  size_type sVar2;
  size_type sVar3;
  size_t sVar4;
  size_type sVar5;
  reference pvVar6;
  const_pointer pcVar7;
  string local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  const_iterator local_70;
  string_view local_68;
  Decompiler *local_58;
  char *local_50;
  Value *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  unsigned_long width;
  Value *pVStack_30;
  Precedence precedence_local;
  Value *child_local;
  Decompiler *this_local;
  string_view prefix_local;
  
  prefix_local.data_ = (char *)prefix.size_;
  this_local = (Decompiler *)prefix.data_;
  width._4_4_ = precedence;
  pVStack_30 = child;
  child_local = (Value *)this;
  prefix_local.size_ = (size_type)__return_storage_ptr__;
  sVar2 = string_view::size((string_view *)&this_local);
  sVar3 = string_view::size(&postfix);
  sVar4 = Value::width(pVStack_30);
  v = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)(sVar2 + sVar3 + sVar4);
  local_48 = pVStack_30;
  if ((v < (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this->target_exp_width) ||
     ((sVar2 = string_view::size((string_view *)&this_local), sVar2 <= this->indent_amount &&
      (sVar2 = string_view::size(&postfix), sVar2 <= this->indent_amount)))) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_48->v);
    pVVar1 = pVStack_30;
    if (sVar5 == 1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_48->v,0);
      pcVar7 = string_view::data((string_view *)&this_local);
      string_view::size((string_view *)&this_local);
      std::__cxx11::string::insert((ulong)pvVar6,(char *)0x0,(ulong)pcVar7);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_48->v,0);
      pcVar7 = string_view::data(&postfix);
      string_view::size(&postfix);
      std::__cxx11::string::append((char *)pvVar6,(ulong)pcVar7);
    }
    else {
      sVar2 = string_view::size((string_view *)&this_local);
      local_58 = this_local;
      local_50 = prefix_local.data_;
      first_indent.size_ = (size_type)prefix_local.data_;
      first_indent.data_ = (char *)this_local;
      IndentValue(this,pVVar1,sVar2,first_indent);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&local_48->v);
      pcVar7 = string_view::data(&postfix);
      string_view::size(&postfix);
      std::__cxx11::string::append((char *)pvVar6,(ulong)pcVar7);
    }
  }
  else {
    pVVar1 = pVStack_30;
    sVar4 = this->indent_amount;
    string_view::string_view(&local_68);
    IndentValue(this,pVVar1,sVar4,local_68);
    pVVar1 = local_48;
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_48->v);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_70,&local_78);
    string_view::operator_cast_to_string(&local_98,(string_view *)&this_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&pVVar1->v,local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&local_48->v);
    pcVar7 = string_view::data(&postfix);
    string_view::size(&postfix);
    std::__cxx11::string::append((char *)pvVar6,(ulong)pcVar7);
  }
  pVStack_30->precedence = width._4_4_;
  Value::Value(__return_storage_ptr__,pVStack_30);
  return __return_storage_ptr__;
}

Assistant:

Value WrapChild(Value &child, string_view prefix, string_view postfix,
                  Precedence precedence) {
    auto width = prefix.size() + postfix.size() + child.width();
    auto &v = child.v;
    if (width < target_exp_width ||
        (prefix.size() <= indent_amount && postfix.size() <= indent_amount)) {
      if (v.size() == 1) {
        // Fits in a single line.
        v[0].insert(0, prefix.data(), prefix.size());
        v[0].append(postfix.data(), postfix.size());
      } else {
        // Multiline, but with prefix on same line.
        IndentValue(child, prefix.size(), prefix);
        v.back().append(postfix.data(), postfix.size());
      }
    } else {
      // Multiline with prefix on its own line.
      IndentValue(child, indent_amount, {});
      v.insert(v.begin(), std::string(prefix));
      v.back().append(postfix.data(), postfix.size());
    }
    child.precedence = precedence;
    return std::move(child);
  }